

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this,cmGeneratorTarget *target)

{
  pointer pcVar1;
  cmOSXBundleGenerator *pcVar2;
  TargetType TVar3;
  cmOSXBundleGenerator *pcVar4;
  pointer *__ptr;
  cmOSXBundleGenerator *local_f8;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileLibraryTargetGenerator_0067ed80;
  (this->FrameworkVersion)._M_dataplus._M_p = (pointer)&(this->FrameworkVersion).field_2;
  (this->FrameworkVersion)._M_string_length = 0;
  (this->FrameworkVersion).field_2._M_local_buf[0] = '\0';
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  TVar3 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar3 != INTERFACE_LIBRARY) {
    cmGeneratorTarget::GetLibraryNames
              ((Names *)local_f0,
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames,(string *)local_f0);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.Output,
               (string *)&local_d0);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.Real,
               (string *)&local_b0);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.ImportLibrary,
               (string *)&local_90);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.PDB,
               (string *)&local_70);
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmMakefileTargetGenerator).TargetNames.SharedObject,
               (string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
  }
  pcVar4 = (cmOSXBundleGenerator *)operator_new(0x40);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName.
           _M_dataplus._M_p;
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar1,
             pcVar1 + (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      ConfigName._M_string_length);
  cmOSXBundleGenerator::cmOSXBundleGenerator(pcVar4,target,(string *)local_f0);
  local_f8 = pcVar4;
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  pcVar2 = local_f8;
  local_f8 = (cmOSXBundleGenerator *)0x0;
  pcVar4 = (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = pcVar2;
  if (pcVar4 != (cmOSXBundleGenerator *)0x0) {
    std::default_delete<cmOSXBundleGenerator>::operator()
              ((default_delete<cmOSXBundleGenerator> *)
               &(this->super_cmMakefileTargetGenerator).OSXBundleGenerator,pcVar4);
  }
  if (local_f8 != (cmOSXBundleGenerator *)0x0) {
    std::default_delete<cmOSXBundleGenerator>::operator()
              ((default_delete<cmOSXBundleGenerator> *)&local_f8,local_f8);
  }
  ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
   super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
   super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
   super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl)->MacContentFolders =
       &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  if (this->GeneratorTarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    this->TargetNames =
      this->GeneratorTarget->GetLibraryNames(this->ConfigName);
  }

  this->OSXBundleGenerator =
    cm::make_unique<cmOSXBundleGenerator>(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}